

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,PrimitiveType type)

{
  undefined4 in_ESI;
  Drawable *in_RDI;
  
  Drawable::Drawable(in_RDI);
  GlResource::GlResource((GlResource *)0x2b2a34);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00493938;
  *(undefined4 *)&in_RDI[1]._vptr_Drawable = 0;
  in_RDI[2]._vptr_Drawable = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_Drawable = in_ESI;
  *(undefined4 *)((long)&in_RDI[3]._vptr_Drawable + 4) = 0;
  return;
}

Assistant:

VertexBuffer::VertexBuffer(PrimitiveType type) :
m_buffer       (0),
m_size         (0),
m_primitiveType(type),
m_usage        (Stream)
{
}